

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

size_t __thiscall efsw::String::find_last_not_of(String *this,char *s,size_t pos,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  String local_38;
  
  String(&local_38,s);
  sVar3 = (this->mString)._M_string_length;
  uVar2 = 0xffffffffffffffff;
  if (sVar3 != 0) {
    uVar1 = sVar3 - 1;
    if (pos <= uVar1) {
      uVar1 = pos;
    }
    uVar2 = uVar1;
    if (local_38.mString._M_string_length != 0) {
      do {
        sVar3 = 0;
        while (local_38.mString._M_dataplus._M_p[sVar3] != (this->mString)._M_dataplus._M_p[uVar1])
        {
          sVar3 = sVar3 + 1;
          uVar2 = uVar1;
          if (local_38.mString._M_string_length == sVar3) goto LAB_001088f9;
        }
        bVar4 = uVar1 != 0;
        uVar1 = uVar1 - 1;
        uVar2 = 0xffffffffffffffff;
      } while (bVar4);
    }
  }
LAB_001088f9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  return uVar2;
}

Assistant:

std::size_t String::find_last_not_of( const char* s, std::size_t pos, std::size_t n ) const {
	return find_last_not_of( String( s ), pos );
}